

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triangulated_Surface.cpp
# Opt level: O2

void __thiscall
Nova::Triangulated_Surface<float>::Initialize_Cylinder_Tessellation
          (Triangulated_Surface<float> *this,Cylinder<float> *cylinder,int m,int n,bool create_caps)

{
  Cylinder<float> *pCVar1;
  pointer pVVar2;
  pointer pVVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  int iVar7;
  Simplex_Mesh<3> *this_00;
  Simplex_Mesh<3> *this_01;
  int iVar8;
  float fVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  float fVar13;
  int j;
  int iVar14;
  int i;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar15;
  Vector<float,_3,_true> data_copy;
  Vector<float,_3,_true> local_84;
  undefined1 local_78 [24];
  Simplex_Mesh<3> *local_60;
  undefined1 local_58 [16];
  ulong local_40;
  Triangulated_Surface<float> *local_38;
  
  pVVar2 = (this->super_Point_Cloud<float,_3>).points._data.
           super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_Point_Cloud<float,_3>).points._data.
      super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pVVar2) {
    (this->super_Point_Cloud<float,_3>).points._data.
    super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pVVar2;
  }
  pVVar3 = (this->super_Simplex_Mesh<3>).elements._data.
           super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_Simplex_Mesh<3>).elements._data.
      super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>.
      _M_impl.super__Vector_impl_data._M_finish != pVVar3) {
    (this->super_Simplex_Mesh<3>).elements._data.
    super__Vector_base<Nova::Vector<int,_3,_true>,_std::allocator<Nova::Vector<int,_3,_true>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = pVVar3;
  }
  fVar15 = (float)two_pi;
  local_60 = &this->super_Simplex_Mesh<3>;
  fVar9 = *(float *)cylinder;
  pCVar1 = cylinder + 0x14;
  local_40 = 0;
  if (0 < n) {
    local_40 = (ulong)(uint)n;
  }
  iVar7 = (int)local_40;
  iVar10 = 0;
  if (0 < m) {
    iVar10 = m;
  }
  for (iVar8 = 1; iVar8 != iVar10 + 1; iVar8 = iVar8 + 1) {
    uVar12 = local_40 & 0xffffffff;
    iVar14 = 1;
    while (iVar11 = (int)uVar12, uVar12 = (ulong)(iVar11 - 1), iVar11 != 0) {
      local_78._0_16_ = *(undefined1 (*) [16])(cylinder + 4);
      dVar4 = (double)((float)(iVar14 + -1) * (fVar15 / (float)n));
      dVar5 = sin(dVar4);
      local_58._8_4_ = extraout_XMM0_Dc;
      local_58._0_8_ = dVar5;
      local_58._12_4_ = extraout_XMM0_Dd;
      auVar6._4_4_ = *(undefined4 *)(cylinder + 4);
      auVar6._0_4_ = local_78._0_4_;
      auVar6._8_4_ = local_78._4_4_;
      auVar6._12_4_ = 0;
      local_78._0_16_ = auVar6;
      dVar4 = cos(dVar4);
      local_84._data._M_elems[2] = (float)dVar4 * (float)local_78._4_4_;
      local_84._data._M_elems[1] = (float)(double)local_58._0_8_ * (float)local_78._0_4_;
      data_copy._data._M_elems._0_8_ = *(undefined8 *)pCVar1;
      data_copy._data._M_elems[2] = *(float *)(cylinder + 0x1c);
      local_84._data._M_elems[0] = (float)(iVar8 + -1) * (fVar9 / (float)(m + -1));
      Vector<float,_3,_true>::operator+=(&data_copy,&local_84);
      Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&data_copy);
      iVar14 = iVar14 + 1;
    }
  }
  if (create_caps) {
    Vector<float,_3,_true>::Vector(&local_84);
    data_copy._data._M_elems[2] = *(float *)(cylinder + 0x1c);
    data_copy._data._M_elems._0_8_ = *(undefined8 *)pCVar1;
    Vector<float,_3,_true>::operator+=(&data_copy,&local_84);
    Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&data_copy);
    local_84._data._M_elems[0] = *(float *)cylinder;
    local_84._data._M_elems[1] = 0.0;
    local_84._data._M_elems[2] = 0.0;
    data_copy._data._M_elems._0_8_ = *(undefined8 *)pCVar1;
    data_copy._data._M_elems[2] = *(float *)(cylinder + 0x1c);
    Vector<float,_3,_true>::operator+=(&data_copy,&local_84);
    Point_Cloud<float,_3>::Add_Vertex(&this->super_Point_Cloud<float,_3>,&data_copy);
  }
  this_00 = local_60;
  iVar8 = (m + -1) * n + -1;
  fVar9 = 0.0;
  local_38 = this;
  iVar10 = 1;
  while (iVar10 != iVar7 + 1) {
    iVar11 = iVar10 + 1;
    local_58._0_4_ = iVar11;
    iVar14 = 1;
    if (iVar10 == n) {
      iVar11 = 1;
    }
    local_78._0_4_ = fVar9;
    fVar15 = (float)(iVar11 + -1);
    for (; this_01 = local_60, iVar14 < m; iVar14 = iVar14 + 1) {
      fVar13 = (float)(n + (int)fVar15);
      data_copy._data._M_elems[1] = (float)(n + (int)fVar9);
      data_copy._data._M_elems[0] = fVar9;
      data_copy._data._M_elems[2] = fVar13;
      Simplex_Mesh<3>::Add_Element(this_00,(INDEX *)&data_copy);
      data_copy._data._M_elems[1] = fVar13;
      data_copy._data._M_elems[2] = fVar15;
      Simplex_Mesh<3>::Add_Element(this_00,(INDEX *)&data_copy);
      fVar15 = fVar13;
      fVar9 = (float)(n + (int)fVar9);
    }
    if (create_caps) {
      data_copy._data._M_elems[1] = (float)(iVar10 + -1);
      data_copy._data._M_elems[0] = (float)(n * m);
      data_copy._data._M_elems[2] = (float)(iVar11 + -1);
      Simplex_Mesh<3>::Add_Element(local_60,(INDEX *)&data_copy);
      data_copy._data._M_elems[2] = (float)(iVar10 + iVar8);
      data_copy._data._M_elems[1] = (float)(iVar11 + iVar8);
      data_copy._data._M_elems[0] = (float)(n * m + 1);
      Simplex_Mesh<3>::Add_Element(this_01,(INDEX *)&data_copy);
    }
    fVar9 = (float)(local_78._0_4_ + 1);
    iVar10 = local_58._0_4_;
  }
  (local_38->super_Simplex_Mesh<3>).number_of_nodes =
       ((long)(local_38->super_Point_Cloud<float,_3>).points._data.
              super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
       (long)(local_38->super_Point_Cloud<float,_3>).points._data.
             super__Vector_base<Nova::Vector<float,_3,_true>,_std::allocator<Nova::Vector<float,_3,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start) / 0xc;
  return;
}

Assistant:

void Nova::Triangulated_Surface<T>::
Initialize_Cylinder_Tessellation(const Cylinder<T>& cylinder,const int m,const int n,const bool create_caps)
{
    points.Clear();elements.Clear();

    T dtheta=(T)two_pi/n,dlength=cylinder.height/(m-1);
    for(int i=1;i<=m;++i) for(int j=1;j<=n;++j){T theta=(j-1)*dtheta;
        Add_Vertex(cylinder.plane1.x1+TV({dlength*(i-1),cylinder.radius*(T)sin(theta),cylinder.radius*(T)cos(theta)}));}
    if(create_caps){Add_Vertex(cylinder.plane1.x1+TV());Add_Vertex(cylinder.plane1.x1+TV({cylinder.height,0,0}));}

    for(int j=1;j<=n;++j){int j_1=j==n?1:j+1;
        for(int i=1;i<=m-1;++i){
            Add_Element(INDEX({j+(i-1)*n-1,j+i*n-1,j_1+i*n-1}));
            Add_Element(INDEX({j+(i-1)*n-1,j_1+i*n-1,j_1+(i-1)*n-1}));}
        if(create_caps){
            Add_Element(INDEX({m*n,j-1,j_1-1}));
            Add_Element(INDEX({m*n+1,j_1+(m-1)*n-1,j+(m-1)*n-1}));}}
    number_of_nodes=points.size();
}